

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t ulocimp_getCountry_63(char *localeID,char *country,int32_t countryCapacity,char **pEnd)

{
  char cVar1;
  int16_t iVar2;
  bool bVar3;
  int local_3c;
  int32_t i;
  char local_30 [3];
  UBool gotCountry;
  int32_t offset;
  char cnty [4];
  int32_t idLen;
  char **pEnd_local;
  int32_t countryCapacity_local;
  char *country_local;
  char *localeID_local;
  
  offset = 0;
  _cnty = pEnd;
  memset(local_30,0,4);
  while( true ) {
    bVar3 = false;
    if (((localeID[offset] != '\0') && (bVar3 = false, localeID[offset] != '.')) &&
       (bVar3 = false, localeID[offset] != '@')) {
      bVar3 = true;
      if (localeID[offset] != '_') {
        bVar3 = localeID[offset] == '-';
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (!bVar3) break;
    if (offset < 3) {
      cVar1 = uprv_toupper_63(localeID[offset]);
      local_30[offset] = cVar1;
    }
    offset = offset + 1;
  }
  if ((offset == 2) || (offset == 3)) {
    bVar3 = false;
    if (offset == 3) {
      iVar2 = _findIndex(COUNTRIES_3,local_30);
      bVar3 = -1 < iVar2;
      if (bVar3) {
        offset = _copyCount(country,countryCapacity,COUNTRIES[(int)iVar2]);
      }
    }
    if (!bVar3) {
      for (local_3c = 0; local_3c < offset; local_3c = local_3c + 1) {
        if (local_3c < countryCapacity) {
          cVar1 = uprv_toupper_63(localeID[local_3c]);
          country[local_3c] = cVar1;
        }
      }
    }
    country_local = localeID + offset;
  }
  else {
    offset = 0;
    country_local = localeID;
  }
  if (_cnty != (char **)0x0) {
    *_cnty = country_local;
  }
  return offset;
}

Assistant:

U_CFUNC int32_t
ulocimp_getCountry(const char *localeID,
                   char *country, int32_t countryCapacity,
                   const char **pEnd)
{
    int32_t idLen=0;
    char cnty[ULOC_COUNTRY_CAPACITY]={ 0, 0, 0, 0 };
    int32_t offset;

    /* copy the country as far as possible and count its length */
    while(!_isTerminator(localeID[idLen]) && !_isIDSeparator(localeID[idLen])) {
        if(idLen<(ULOC_COUNTRY_CAPACITY-1)) {   /*CWB*/
            cnty[idLen]=(char)uprv_toupper(localeID[idLen]);
        }
        idLen++;
    }

    /* the country should be either length 2 or 3 */
    if (idLen == 2 || idLen == 3) {
        UBool gotCountry = FALSE;
        /* convert 3 character code to 2 character code if possible *CWB*/
        if(idLen==3) {
            offset=_findIndex(COUNTRIES_3, cnty);
            if(offset>=0) {
                idLen=_copyCount(country, countryCapacity, COUNTRIES[offset]);
                gotCountry = TRUE;
            }
        }
        if (!gotCountry) {
            int32_t i = 0;
            for (i = 0; i < idLen; i++) {
                if (i < countryCapacity) {
                    country[i]=(char)uprv_toupper(localeID[i]);
                }
            }
        }
        localeID+=idLen;
    } else {
        idLen = 0;
    }

    if(pEnd!=NULL) {
        *pEnd=localeID;
    }

    return idLen;
}